

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O1

bool __thiscall Name_Num::operator<(Name_Num *this,Name_Num *other)

{
  char cVar1;
  char *__s;
  char *__s_00;
  difference_type __diff2;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  
  __s = this->name;
  sVar2 = strlen(__s);
  __s_00 = other->name;
  sVar3 = strlen(__s_00);
  if ((long)sVar3 < (long)sVar2) {
    sVar2 = sVar3;
  }
  pcVar4 = __s_00;
  if (sVar2 != 0) {
    pcVar4 = __s_00 + sVar2;
    sVar5 = 0;
    do {
      cVar1 = __s[sVar5];
      if (__s_00[sVar5] != cVar1) {
        bVar6 = cVar1 < __s_00[sVar5];
        goto LAB_00226288;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  bVar6 = pcVar4 != __s_00 + sVar3;
LAB_00226288:
  return (bool)(this->number < other->number | bVar6);
}

Assistant:

bool operator<(const Name_Num &other) const
  {
    return std::lexicographical_compare(name, name + strlen(name), other.name,
                                        other.name + strlen(other.name)) ||
           (number < other.number);
  }